

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fopen.c
# Opt level: O0

CURLcode Curl_fopen(Curl_easy *data,char *filename,FILE **fh,char **tempname)

{
  int iVar1;
  CURLcode CVar2;
  FILE *pFVar3;
  undefined1 local_170 [8];
  stat nsb;
  undefined1 local_d8 [4];
  int fd;
  stat sb;
  char *tempstore;
  uchar randsuffix [9];
  CURLcode result;
  char **tempname_local;
  FILE **fh_local;
  char *filename_local;
  Curl_easy *data_local;
  
  randsuffix[1] = '\x17';
  randsuffix[2] = '\0';
  randsuffix[3] = '\0';
  randsuffix[4] = '\0';
  sb.__glibc_reserved[2] = 0;
  nsb.__glibc_reserved[2]._4_4_ = -1;
  *tempname = (char *)0x0;
  unique0x1000016a = tempname;
  iVar1 = stat64(filename,(stat64 *)local_d8);
  if ((iVar1 == -1) || (((uint)sb.st_nlink & 0xf000) != 0x8000)) {
    pFVar3 = fopen64(filename,"w");
    *fh = (FILE *)pFVar3;
    if (*fh != (FILE *)0x0) {
      return CURLE_OK;
    }
  }
  else {
    randsuffix._1_4_ = Curl_rand_hex(data,(uchar *)((long)&tempstore + 3),9);
    if (randsuffix._1_4_ == CURLE_OK) {
      sb.__glibc_reserved[2] =
           (__syscall_slong_t)curl_maprintf("%s.%s.tmp",filename,(long)&tempstore + 3);
      if ((char *)sb.__glibc_reserved[2] == (char *)0x0) {
        randsuffix[1] = '\x1b';
        randsuffix[2] = '\0';
        randsuffix[3] = '\0';
        randsuffix[4] = '\0';
      }
      else {
        randsuffix[1] = '\x17';
        randsuffix[2] = '\0';
        randsuffix[3] = '\0';
        randsuffix[4] = '\0';
        nsb.__glibc_reserved[2]._4_4_ = open64((char *)sb.__glibc_reserved[2],0xc1,0x180);
        if ((nsb.__glibc_reserved[2]._4_4_ != -1) &&
           ((((iVar1 = fstat64(nsb.__glibc_reserved[2]._4_4_,(stat64 *)local_170), iVar1 == -1 ||
              (nsb.st_nlink._4_4_ != sb.st_nlink._4_4_)) || (nsb.st_mode != sb.st_mode)) ||
            (iVar1 = fchmod(nsb.__glibc_reserved[2]._4_4_,(uint)sb.st_nlink), iVar1 != -1)))) {
          pFVar3 = fdopen(nsb.__glibc_reserved[2]._4_4_,"w");
          *fh = (FILE *)pFVar3;
          if (*fh != (FILE *)0x0) {
            *stack0xffffffffffffffd0 = (char *)sb.__glibc_reserved[2];
            return CURLE_OK;
          }
        }
      }
    }
  }
  if (nsb.__glibc_reserved[2]._4_4_ != -1) {
    close(nsb.__glibc_reserved[2]._4_4_);
    unlink((char *)sb.__glibc_reserved[2]);
  }
  (*Curl_cfree)((void *)sb.__glibc_reserved[2]);
  *stack0xffffffffffffffd0 = (char *)0x0;
  CVar2._0_1_ = randsuffix[1];
  CVar2._1_1_ = randsuffix[2];
  CVar2._2_1_ = randsuffix[3];
  CVar2._3_1_ = randsuffix[4];
  return CVar2;
}

Assistant:

CURLcode Curl_fopen(struct Curl_easy *data, const char *filename,
                    FILE **fh, char **tempname)
{
  CURLcode result = CURLE_WRITE_ERROR;
  unsigned char randsuffix[9];
  char *tempstore = NULL;
  struct_stat sb;
  int fd = -1;
  *tempname = NULL;

  if(stat(filename, &sb) == -1 || !S_ISREG(sb.st_mode)) {
    /* a non-regular file, fallback to direct fopen() */
    *fh = fopen(filename, FOPEN_WRITETEXT);
    if(*fh)
      return CURLE_OK;
    goto fail;
  }

  result = Curl_rand_hex(data, randsuffix, sizeof(randsuffix));
  if(result)
    goto fail;

  tempstore = aprintf("%s.%s.tmp", filename, randsuffix);
  if(!tempstore) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  result = CURLE_WRITE_ERROR;
  fd = open(tempstore, O_WRONLY | O_CREAT | O_EXCL, 0600);
  if(fd == -1)
    goto fail;

#ifdef HAVE_FCHMOD
  {
    struct_stat nsb;
    if((fstat(fd, &nsb) != -1) &&
       (nsb.st_uid == sb.st_uid) && (nsb.st_gid == sb.st_gid)) {
      /* if the user and group are the same, clone the original mode */
      if(fchmod(fd, sb.st_mode) == -1)
        goto fail;
    }
  }
#endif

  *fh = fdopen(fd, FOPEN_WRITETEXT);
  if(!*fh)
    goto fail;

  *tempname = tempstore;
  return CURLE_OK;

fail:
  if(fd != -1) {
    close(fd);
    unlink(tempstore);
  }

  free(tempstore);

  *tempname = NULL;
  return result;
}